

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# droplayer.cpp
# Opt level: O3

void __thiscall DROPlayer::GenerateDeviceConfig(DROPlayer *this)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  undefined8 *puVar2;
  uchar uVar3;
  pointer puVar4;
  pointer p_Var5;
  size_t sVar6;
  char *pcVar7;
  undefined4 uVar8;
  char *pcVar9;
  long lVar10;
  ulong uVar11;
  char chipNameFull [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  DROPlayer *local_50;
  char local_48 [24];
  
  p_Var5 = (this->_devCfgs).
           super__Vector_base<_device_generic_config,_std::allocator<_device_generic_config>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((this->_devCfgs).
      super__Vector_base<_device_generic_config,_std::allocator<_device_generic_config>_>._M_impl.
      super__Vector_impl_data._M_finish != p_Var5) {
    (this->_devCfgs).
    super__Vector_base<_device_generic_config,_std::allocator<_device_generic_config>_>._M_impl.
    super__Vector_impl_data._M_finish = p_Var5;
  }
  std::vector<_device_generic_config,_std::allocator<_device_generic_config>_>::resize
            (&this->_devCfgs,
             (long)(this->_devTypes).
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(this->_devTypes).
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start);
  this_00 = &this->_devNames;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase_at_end(this_00,(this->_devNames).
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
  p_Var5 = (this->_devCfgs).
           super__Vector_base<_device_generic_config,_std::allocator<_device_generic_config>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((this->_devCfgs).
      super__Vector_base<_device_generic_config,_std::allocator<_device_generic_config>_>._M_impl.
      super__Vector_impl_data._M_finish != p_Var5) {
    paVar1 = &local_70.field_2;
    lVar10 = 8;
    uVar11 = 0;
    local_50 = this;
    do {
      puVar2 = (undefined8 *)((long)p_Var5 + lVar10 + -8);
      *puVar2 = 0;
      puVar2[1] = 0;
      *(undefined4 *)((long)&p_Var5->emuCore + lVar10) = 0x369e99;
      puVar4 = (this->_devTypes).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_start;
      uVar8 = 0xda7a64;
      if (puVar4[uVar11] != '\f') {
        uVar8 = 0x369e99;
      }
      *(undefined4 *)((long)&p_Var5->emuCore + lVar10) = uVar8;
      *(undefined1 *)((long)p_Var5 + lVar10 + -3) = 0;
      uVar3 = puVar4[uVar11];
      pcVar7 = "OPL3";
      if (uVar3 != '\f') {
        pcVar7 = "OPL2";
      }
      if ((ulong)((long)(this->_devCfgs).
                        super__Vector_base<_device_generic_config,_std::allocator<_device_generic_config>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(this->_devCfgs).
                       super__Vector_base<_device_generic_config,_std::allocator<_device_generic_config>_>
                       ._M_impl.super__Vector_impl_data._M_start) < 0x11) {
        pcVar9 = "OPL3";
        if (uVar3 != '\f') {
          pcVar9 = "OPL2";
        }
        local_70._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,pcVar7,pcVar9 + 4);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,
                   &local_70);
      }
      else {
        snprintf(local_48,0x10,"%s #%u",pcVar7,(ulong)((int)uVar11 + 1));
        local_70._M_dataplus._M_p = (pointer)paVar1;
        sVar6 = strlen(local_48);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_70,local_48,local_48 + sVar6);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,
                   &local_70);
        this = local_50;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != paVar1) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
      uVar11 = uVar11 + 1;
      p_Var5 = (this->_devCfgs).
               super__Vector_base<_device_generic_config,_std::allocator<_device_generic_config>_>.
               _M_impl.super__Vector_impl_data._M_start;
      lVar10 = lVar10 + 0x10;
    } while (uVar11 < (ulong)((long)(this->_devCfgs).
                                    super__Vector_base<_device_generic_config,_std::allocator<_device_generic_config>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)p_Var5 >> 4))
    ;
  }
  return;
}

Assistant:

void DROPlayer::GenerateDeviceConfig(void)
{
	size_t curDev;
	const char* chipName;
	char chipNameFull[0x10];
	
	_devCfgs.clear();
	_devCfgs.resize(_devTypes.size());
	_devNames.clear();
	for (curDev = 0; curDev < _devCfgs.size(); curDev ++)
	{
		DEV_GEN_CFG* devCfg = &_devCfgs[curDev];
		memset(devCfg, 0x00, sizeof(DEV_GEN_CFG));
		
		devCfg->clock = 3579545;
		if (_devTypes[curDev] == DEVID_YMF262)
			devCfg->clock *= 4;	// OPL3 uses a 14 MHz clock
		devCfg->flags = 0x00;
		
		chipName = (_devTypes[curDev] == DEVID_YMF262) ? "OPL3" : "OPL2";
		if (_devCfgs.size() <= 1)
		{
			_devNames.push_back(chipName);
		}
		else
		{
			snprintf(chipNameFull, 0x10, "%s #%u", chipName, 1 + (unsigned int)curDev);
			_devNames.push_back(chipNameFull);
		}
	}
	
	return;
}